

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O1

QVariant * __thiscall
QGenericUnixTheme::themeHint
          (QVariant *__return_storage_ptr__,QGenericUnixTheme *this,ThemeHint hint)

{
  QSize QVar1;
  int iVar2;
  long in_FS_OFFSET;
  QString local_78;
  QString local_60;
  QArrayDataPointer<QString> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (0x22 < (int)hint) {
    if ((int)hint < 0x2f) {
      if (hint == IconFallbackSearchPaths) {
        iconFallbackPaths();
        goto LAB_0063ca27;
      }
      if (hint == MouseCursorTheme) {
        mouseCursorTheme();
        goto LAB_0063c89f;
      }
    }
    else {
      if (hint == MouseCursorSize) {
        QVar1 = mouseCursorSize();
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          ::QVariant::QVariant(__return_storage_ptr__,QVar1);
          return __return_storage_ptr__;
        }
        goto LAB_0063ca95;
      }
      if (hint == PreferFileIconFromTheme) goto switchD_0063c857_caseD_14;
    }
switchD_0063c857_caseD_12:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      QPlatformTheme::themeHint(__return_storage_ptr__,&this->super_QPlatformTheme,hint);
      return __return_storage_ptr__;
    }
    goto LAB_0063ca95;
  }
  switch(hint) {
  case SystemIconFallbackThemeName:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x6d8c24;
    local_48.size = 7;
LAB_0063c89f:
    ::QVariant::QVariant(__return_storage_ptr__,(QString *)&local_48);
    if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_0063ca3a;
  case IconThemeSearchPaths:
    xdgIconThemePaths();
    goto LAB_0063ca27;
  case StyleNames:
    local_48.d = (Data *)0x0;
    local_48.ptr = (QString *)0x0;
    local_48.size = 0;
    local_60.d.d = (Data *)0x0;
    local_60.d.ptr = L"Fusion";
    local_60.d.size = 6;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_48,0,&local_60);
    QList<QString>::end((QList<QString> *)&local_48);
    local_78.d.d = (Data *)0x0;
    local_78.d.ptr = L"Windows";
    local_78.d.size = 7;
    QtPrivate::QMovableArrayOps<QString>::emplace<QString>
              ((QMovableArrayOps<QString> *)&local_48,local_48.size,&local_78);
    QList<QString>::end((QList<QString> *)&local_48);
    if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
      }
    }
LAB_0063ca27:
    ::QVariant::QVariant(__return_storage_ptr__,(QList_conflict *)&local_48);
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
LAB_0063ca3a:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return __return_storage_ptr__;
    }
    break;
  default:
    goto switchD_0063c857_caseD_12;
  case DialogButtonBoxButtonsHaveIcons:
switchD_0063c857_caseD_14:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      ::QVariant::QVariant(__return_storage_ptr__,true);
      return __return_storage_ptr__;
    }
    break;
  case KeyboardScheme:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar2 = 2;
LAB_0063ca13:
      ::QVariant::QVariant(__return_storage_ptr__,iVar2);
      return __return_storage_ptr__;
    }
    break;
  case UiEffects:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar2 = 0x80;
      goto LAB_0063ca13;
    }
  }
LAB_0063ca95:
  __stack_chk_fail();
}

Assistant:

QVariant QGenericUnixTheme::themeHint(ThemeHint hint) const
{
    switch (hint) {
    case QPlatformTheme::SystemIconFallbackThemeName:
        return QVariant(QString(QStringLiteral("hicolor")));
    case QPlatformTheme::IconThemeSearchPaths:
        return xdgIconThemePaths();
    case QPlatformTheme::IconFallbackSearchPaths:
        return iconFallbackPaths();
    case QPlatformTheme::DialogButtonBoxButtonsHaveIcons:
        return QVariant(true);
    case QPlatformTheme::StyleNames: {
        QStringList styleNames;
        styleNames << QStringLiteral("Fusion") << QStringLiteral("Windows");
        return QVariant(styleNames);
    }
    case QPlatformTheme::KeyboardScheme:
        return QVariant(int(X11KeyboardScheme));
    case QPlatformTheme::UiEffects:
        return QVariant(int(HoverEffect));
    case QPlatformTheme::MouseCursorTheme:
        return QVariant(mouseCursorTheme());
    case QPlatformTheme::MouseCursorSize:
        return QVariant(mouseCursorSize());
    case QPlatformTheme::PreferFileIconFromTheme:
        return true;
    default:
        break;
    }
    return QPlatformTheme::themeHint(hint);
}